

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O1

void __thiscall SerialAnalyzer::WorkerThread(SerialAnalyzer *this)

{
  Mode MVar1;
  SerialAnalyzerSettings *pSVar2;
  SerialAnalyzerResults *pSVar3;
  char cVar4;
  byte bVar5;
  U32 UVar6;
  BitState BVar7;
  int iVar8;
  AnalyzerChannelData *pAVar9;
  ulonglong uVar10;
  MarkerType MVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  U64 data;
  FrameV2 frameV2;
  DataBuilder data_builder;
  U8 bytes [8];
  ulong local_b8;
  FrameV2 local_b0 [8];
  ulong local_a8;
  uint local_9c;
  ulonglong local_98;
  int local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulonglong local_68;
  undefined8 local_60;
  ulong local_58;
  byte local_47;
  DataBuilder local_40 [8];
  undefined1 local_38 [8];
  
  UVar6 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar6;
  ComputeSampleOffsets(this);
  pSVar2 = (this->mSettings)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
           .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl;
  UVar6 = pSVar2->mBitsPerTransfer;
  MVar1 = pSVar2->mSerialMode;
  local_9c = UVar6 + 7;
  bVar16 = pSVar2->mInverted;
  this->mBitHigh = bVar16 ^ BIT_HIGH;
  this->mBitLow = (uint)bVar16;
  uVar14 = (MVar1 != Normal) + UVar6;
  if (uVar14 == 0) {
    uVar15 = 0;
  }
  else {
    uVar13 = 1;
    uVar15 = 0;
    uVar12 = uVar14;
    do {
      uVar15 = uVar15 | uVar13;
      uVar13 = uVar13 * 2;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar12 = local_9c >> 3;
  pAVar9 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar9;
  AnalyzerChannelData::TrackMinimumPulseWidth();
  BVar7 = AnalyzerChannelData::GetBitState();
  if (BVar7 == this->mBitLow) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  local_80 = (ulong)(uVar14 - 1);
  local_88 = uVar15 >> 1;
  local_78 = (ulong)uVar12;
  local_8c = uVar12 * 8 + -8;
  local_70 = (ulong)uVar14;
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar10 = AnalyzerChannelData::GetSampleNumber();
    local_b8 = 0;
    DataBuilder::DataBuilder(local_40);
    uVar13 = local_70;
    DataBuilder::Reset((ulonglong *)local_40,(ShiftOrder)&local_b8,
                       ((this->mSettings)._M_t.
                        super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
                        .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->
                       mShiftOrder);
    local_98 = uVar10;
    if ((int)uVar13 != 0) {
      uVar13 = 0;
      do {
        AnalyzerChannelData::Advance((uint)this->mSerial);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)local_40);
        uVar10 = uVar10 + (this->mSampleOffsets).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13];
        AnalyzerResults::AddMarker
                  ((ulonglong)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                   .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,
                   (MarkerType)uVar10,(Channel *)0x0);
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
    MVar11 = (MarkerType)uVar10;
    pSVar2 = (this->mSettings)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
             .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl;
    if (pSVar2->mInverted != false) {
      local_b8 = ~local_b8 & uVar15;
    }
    MVar1 = pSVar2->mSerialMode;
    if (MVar1 == Normal) {
      local_a8 = 0;
    }
    else {
      local_a8 = local_b8 >> ((byte)local_80 & 0x3f);
      if (MVar1 == MpModeMsbZeroMeansAddress) {
        local_a8 = local_a8 ^ 1;
      }
      else if (MVar1 != MpModeMsbOneMeansAddress) {
        local_a8 = 0;
      }
      local_b8 = local_b8 & local_88;
    }
    if (pSVar2->mParity == None) {
      bVar16 = false;
    }
    else {
      AnalyzerChannelData::Advance((uint)this->mSerial);
      uVar12 = AnalyzerHelpers::GetOnesCount(local_b8);
      cVar4 = AnalyzerHelpers::IsEven((ulong)uVar12);
      if (((this->mSettings)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
           .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->mParity == Even) {
        if (cVar4 != '\0') {
          BVar7 = AnalyzerChannelData::GetBitState();
          goto LAB_001060dd;
        }
        BVar7 = AnalyzerChannelData::GetBitState();
LAB_001060d0:
        bVar16 = BVar7 == this->mBitHigh;
      }
      else {
        if (cVar4 != '\0') {
          BVar7 = AnalyzerChannelData::GetBitState();
          goto LAB_001060d0;
        }
        BVar7 = AnalyzerChannelData::GetBitState();
LAB_001060dd:
        bVar16 = BVar7 == this->mBitLow;
      }
      bVar16 = !bVar16;
      MVar11 = MVar11 + this->mParityBitOffset;
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,MVar11,
                 (Channel *)0x2);
    }
    AnalyzerChannelData::Advance((uint)this->mSerial);
    BVar7 = AnalyzerChannelData::GetBitState();
    bVar17 = true;
    if (BVar7 == this->mBitHigh) {
      iVar8 = AnalyzerChannelData::Advance((uint)this->mSerial);
      bVar17 = iVar8 != 0;
    }
    if (bVar17) {
      MVar11 = MVar11 + this->mStartOfStopBitOffset;
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,MVar11,
                 (Channel *)0x7);
      if (this->mEndOfStopBitOffset != 0) {
        AnalyzerResults::AddMarker
                  ((ulonglong)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                   .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,
                   MVar11 + this->mEndOfStopBitOffset,(Channel *)0x7);
      }
    }
    Frame::Frame((Frame *)&local_68);
    local_68 = local_98;
    local_60 = AnalyzerChannelData::GetSampleNumber();
    local_58 = local_b8;
    bVar5 = 0;
    if (bVar16) {
      bVar5 = 0x82;
    }
    local_47 = bVar5 | 0x81;
    if (!bVar17) {
      local_47 = bVar5;
    }
    if ((local_a8 & 1) != 0) {
      local_47 = local_47 | 4;
      AnalyzerResults::CommitPacketAndStartNewPacket();
    }
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                        .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl);
    FrameV2::FrameV2(local_b0);
    if (7 < local_9c) {
      uVar13 = 0;
      iVar8 = local_8c;
      do {
        local_38[uVar13] = (char)(local_b8 >> ((byte)iVar8 & 0x3f));
        uVar13 = uVar13 + 1;
        iVar8 = iVar8 + -8;
      } while (local_78 != uVar13);
    }
    FrameV2::AddByteArray((char *)local_b0,(uchar *)"data",(ulonglong)local_38);
    if (bVar16 || bVar17) {
      FrameV2::AddString((char *)local_b0,"error");
    }
    if (((this->mSettings)._M_t.
         super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
         ._M_t.
         super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
         .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->mSerialMode !=
        Normal) {
      FrameV2::AddBoolean((char *)local_b0,true);
    }
    pSVar3 = (this->mResults)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
             .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pSVar3,(char *)local_b0,0x109040,local_98);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
    if ((bVar17) && (BVar7 = AnalyzerChannelData::GetBitState(), BVar7 == this->mBitLow)) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    FrameV2::~FrameV2(local_b0);
    Frame::~Frame((Frame *)&local_68);
    DataBuilder::~DataBuilder(local_40);
  } while( true );
}

Assistant:

void SerialAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    ComputeSampleOffsets();

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer++;

    // used for HLA byte count, this should not include an extra bit for MP/MDB
    const U32 bytes_per_transfer = ( mSettings->mBitsPerTransfer + 7 ) / 8;

    if( mSettings->mInverted == false )
    {
        mBitHigh = BIT_HIGH;
        mBitLow = BIT_LOW;
    }
    else
    {
        mBitHigh = BIT_LOW;
        mBitLow = BIT_HIGH;
    }

    U64 bit_mask = 0;
    U64 mask = 0x1ULL;
    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        bit_mask |= mask;
        mask <<= 1;
    }

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );
    mSerial->TrackMinimumPulseWidth();

    if( mSerial->GetBitState() == mBitLow )
        mSerial->AdvanceToNextEdge();

    for( ;; )
    {
        // we're starting high. (we'll assume that we're not in the middle of a byte.)

        mSerial->AdvanceToNextEdge();

        // we're now at the beginning of the start bit.  We can start collecting the data.
        U64 frame_starting_sample = mSerial->GetSampleNumber();

        U64 data = 0;
        bool parity_error = false;
        bool framing_error = false;
        bool mp_is_address = false;

        DataBuilder data_builder;
        data_builder.Reset( &data, mSettings->mShiftOrder, bits_per_transfer );
        U64 marker_location = frame_starting_sample;

        for( U32 i = 0; i < bits_per_transfer; i++ )
        {
            mSerial->Advance( mSampleOffsets[ i ] );
            data_builder.AddBit( mSerial->GetBitState() );

            marker_location += mSampleOffsets[ i ];
            mResults->AddMarker( marker_location, AnalyzerResults::Dot, mSettings->mInputChannel );
        }

        if( mSettings->mInverted == true )
            data = ( ~data ) & bit_mask;

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            // extract the MSB
            U64 msb = data >> ( bits_per_transfer - 1 );
            msb &= 0x1;
            if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbOneMeansAddress )
            {
                mp_is_address = msb == 0x1;
            }
            else if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbZeroMeansAddress )
            {
                mp_is_address = msb == 0x0;
            }
            // now remove the msb.
            data &= ( bit_mask >> 1 );
        }

        parity_error = false;

        if( mSettings->mParity != AnalyzerEnums::None )
        {
            mSerial->Advance( mParityBitOffset );
            bool is_even = AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( data ) );

            if( mSettings->mParity == AnalyzerEnums::Even )
            {
                if( is_even == true )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity even.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity even.
                        parity_error = true;
                }
            }
            else // if( mSettings->mParity == AnalyzerEnums::Odd )
            {
                if( is_even == false )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity odd.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity odd.
                        parity_error = true;
                }
            }

            marker_location += mParityBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::Square, mSettings->mInputChannel );
        }

        // now we must determine if there is a framing error.
        framing_error = false;

        mSerial->Advance( mStartOfStopBitOffset );

        if( mSerial->GetBitState() != mBitHigh )
        {
            framing_error = true;
        }
        else
        {
            U32 num_edges = mSerial->Advance( mEndOfStopBitOffset );
            if( num_edges != 0 )
                framing_error = true;
        }

        if( framing_error == true )
        {
            marker_location += mStartOfStopBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );

            if( mEndOfStopBitOffset != 0 )
            {
                marker_location += mEndOfStopBitOffset;
                mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );
            }
        }

        // ok now record the value!
        // note that we're not using the mData2 or mType fields for anything, so we won't bother to set them.
        Frame frame;
        frame.mStartingSampleInclusive = static_cast<S64>( frame_starting_sample );
        frame.mEndingSampleInclusive = static_cast<S64>( mSerial->GetSampleNumber() );
        frame.mData1 = data;
        frame.mFlags = 0;
        if( parity_error == true )
            frame.mFlags |= PARITY_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( framing_error == true )
            frame.mFlags |= FRAMING_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( mp_is_address == true )
            frame.mFlags |= MP_MODE_ADDRESS_FLAG;

        if( mp_is_address == true )
            mResults->CommitPacketAndStartNewPacket();

        mResults->AddFrame( frame );

        FrameV2 frameV2;

        U8 bytes[ 8 ];
        for( U32 i = 0; i < bytes_per_transfer; ++i )
        {
            auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
            bytes[ i ] = static_cast<U8>( data >> bit_offset );
        }
        frameV2.AddByteArray( "data", bytes, bytes_per_transfer );

        if( parity_error )
        {
            frameV2.AddString( "error", "parity" );
        }
        else if( framing_error )
        {
            frameV2.AddString( "error", "framing" );
        }

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            frameV2.AddBoolean( "address", mp_is_address );
        }

        mResults->AddFrameV2( frameV2, "data", frame_starting_sample, mSerial->GetSampleNumber() );

        mResults->CommitResults();

        ReportProgress( frame.mEndingSampleInclusive );
        CheckIfThreadShouldExit();

        if( framing_error == true ) // if we're still low, let's fix that for the next round.
        {
            if( mSerial->GetBitState() == mBitLow )
                mSerial->AdvanceToNextEdge();
        }
    }
}